

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v10::detail::digit_grouping<char>::apply<fmt::v10::appender,char>
          (digit_grouping<char> *this,appender out,basic_string_view<char> digits)

{
  int iVar1;
  type tVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  size_type sVar7;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  next_state nVar8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_890;
  char local_881;
  size_t local_880;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_878;
  int local_86c;
  int local_868;
  int sep_index;
  int i_1;
  int i;
  int local_858;
  undefined1 local_850 [8];
  next_state state;
  allocator<int> local_829;
  undefined1 local_828 [8];
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> separators;
  int num_digits;
  digit_grouping<char> *this_local;
  basic_string_view<char> digits_local;
  appender out_local;
  
  digits_local.data_ = (char *)digits.size_;
  this_local = (digit_grouping<char> *)digits.data_;
  digits_local.size_ =
       (size_t)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  separators.store_[499] = (int)sVar3;
  std::allocator<int>::allocator(&local_829);
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_std::allocator<int>_> *)local_828,&local_829);
  std::allocator<int>::~allocator(&local_829);
  state.pos = 0;
  buffer<int>::push_back((buffer<int> *)local_828,&state.pos);
  nVar8 = initial_state(this);
  _i_1 = nVar8.group._M_current;
  local_858 = nVar8.pos;
  local_850 = (undefined1  [8])_i_1;
  state.group._M_current._0_4_ = local_858;
  while ((sep_index = next(this,(next_state *)local_850), sep_index != 0 &&
         (sep_index < separators.store_[499]))) {
    buffer<int>::push_back((buffer<int> *)local_828,&sep_index);
  }
  local_868 = 0;
  sVar3 = buffer<int>::size((buffer<int> *)local_828);
  local_86c = (int)sVar3 + -1;
  for (; sVar3 = digits_local.size_, local_868 < separators.store_[499]; local_868 = local_868 + 1)
  {
    iVar1 = separators.store_[499] - local_868;
    piVar4 = buffer<int>::operator[]<int>((buffer<int> *)local_828,local_86c);
    if (iVar1 == *piVar4) {
      this_01 = &this->thousands_sep_;
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         (this_01);
      pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         (this_01);
      sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (this_01);
      local_880 = digits_local.size_;
      local_878.container =
           (buffer<char> *)
           copy_str<char,char_const*>(pcVar5,pcVar6 + sVar7,(appender)digits_local.size_);
      local_86c = local_86c + -1;
      digits_local.size_ = (size_t)local_878.container;
    }
    tVar2 = to_unsigned<int>(local_868);
    pcVar5 = basic_string_view<char>::operator[]
                       ((basic_string_view<char> *)&this_local,(ulong)tVar2);
    local_881 = *pcVar5;
    local_890.container = (buffer<char> *)appender::operator++((appender *)&digits_local.size_,0);
    this_00 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_890);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(this_00,&local_881);
  }
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::~basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_std::allocator<int>_> *)local_828);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)sVar3;
}

Assistant:

auto apply(Out out, basic_string_view<C> digits) const -> Out {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out =
            copy_str<Char>(thousands_sep_.data(),
                           thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }